

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprogressdialog.cpp
# Opt level: O0

void __thiscall QProgressDialog::setCancelButton(QProgressDialog *this,QPushButton *cancelButton)

{
  QProgressDialogPrivate *c;
  QShortcut *this_00;
  QProgressDialogPrivate *in_RSI;
  QObject *in_RDI;
  long in_FS_OFFSET;
  QProgressDialogPrivate *d;
  char *in_stack_ffffffffffffff98;
  undefined8 in_stack_ffffffffffffffa0;
  int line;
  char *in_stack_ffffffffffffffa8;
  Connection local_30;
  char local_28 [32];
  long local_8;
  
  line = (int)((ulong)in_stack_ffffffffffffffa0 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  c = d_func((QProgressDialog *)0x7b166f);
  if ((QProgressDialogPrivate *)c->cancel == in_RSI) {
    if (in_RSI != (QProgressDialogPrivate *)0x0) {
      QMessageLogger::QMessageLogger
                ((QMessageLogger *)in_RDI,in_stack_ffffffffffffffa8,line,in_stack_ffffffffffffff98);
      QMessageLogger::warning
                (local_28,"QProgressDialog::setCancelButton: Attempt to set the same button again");
    }
  }
  else {
    if (c->cancel != (QPushButton *)0x0) {
      (**(code **)(*(long *)&(c->cancel->super_QAbstractButton).super_QWidget + 0x20))();
    }
    c->cancel = (QPushButton *)in_RSI;
    if (in_RSI == (QProgressDialogPrivate *)0x0) {
      if (c->escapeShortcut != (QShortcut *)0x0) {
        (**(code **)(*(long *)c->escapeShortcut + 0x20))();
      }
      c->escapeShortcut = (QShortcut *)0x0;
    }
    else {
      QObject::connect((QObject *)&local_30,(char *)c->cancel,(QObject *)"2clicked()",(char *)in_RDI
                       ,0xb32778);
      QMetaObject::Connection::~Connection(&local_30);
      this_00 = (QShortcut *)operator_new(0x10);
      QShortcut::QShortcut(this_00,Cancel,in_RDI,"2canceled()",(char *)0x0,WindowShortcut);
      c->escapeShortcut = this_00;
    }
    QProgressDialogPrivate::adoptChildWidget(in_RSI,(QWidget *)c);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QProgressDialog::setCancelButton(QPushButton *cancelButton)
{
    Q_D(QProgressDialog);
    if (d->cancel == cancelButton) {
        if (Q_UNLIKELY(cancelButton))
            qWarning("QProgressDialog::setCancelButton: Attempt to set the same button again");
        return;
    }
    delete d->cancel;
    d->cancel = cancelButton;
    if (cancelButton) {
        connect(d->cancel, SIGNAL(clicked()), this, SIGNAL(canceled()));
#ifndef QT_NO_SHORTCUT
        d->escapeShortcut = new QShortcut(QKeySequence::Cancel, this, SIGNAL(canceled()));
#endif
    } else {
#ifndef QT_NO_SHORTCUT
        delete d->escapeShortcut;
        d->escapeShortcut = nullptr;
#endif
    }
    d->adoptChildWidget(cancelButton);
}